

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeViewPrivate::paintAlternatingRowColors
          (QTreeViewPrivate *this,QPainter *painter,QStyleOptionViewItem *option,int y,int bottom)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  QWidget *this_00;
  QObject *pQVar5;
  QWidgetData *pQVar6;
  int iVar7;
  QStyle *pQVar8;
  int extraout_var;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QAbstractItemViewPrivate).alternatingColors == true) {
    this_00 = *(QWidget **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    pQVar8 = QWidget::style(this_00);
    iVar7 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x54,option,this_00,0);
    if (iVar7 != 0) {
      iVar7 = this->defaultItemHeight;
      if (iVar7 < 1) {
        pQVar5 = (this->super_QAbstractItemViewPrivate).itemDelegate.wp.value;
        (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,option);
        iVar7 = extraout_var;
        if (extraout_var < 1) goto LAB_005a03d3;
      }
      if (y <= bottom) {
        do {
          pQVar6 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                   )->data;
          iVar1 = (pQVar6->crect).x2.m_i;
          iVar2 = (pQVar6->crect).x1.m_i;
          (option->super_QStyleOption).rect.x1.m_i = 0;
          (option->super_QStyleOption).rect.y1.m_i = y;
          (option->super_QStyleOption).rect.x2.m_i = iVar1 - iVar2;
          (option->super_QStyleOption).rect.y2.m_i = iVar7 + -1 + y;
          uVar3 = this->current;
          (option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
               ((option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xfffffffd) +
               (uVar3 & 1) * 2;
          this->current = uVar3 + 1;
          pQVar8 = QWidget::style(this_00);
          (**(code **)(*(long *)pQVar8 + 0xb0))(pQVar8,0x2d,option,painter,this_00);
          y = y + iVar7;
        } while (y <= bottom);
      }
    }
  }
LAB_005a03d3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::paintAlternatingRowColors(QPainter *painter, QStyleOptionViewItem *option, int y, int bottom) const
{
    Q_Q(const QTreeView);
    if (!alternatingColors || !q->style()->styleHint(QStyle::SH_ItemView_PaintAlternatingRowColorsForEmptyArea, option, q))
        return;
    int rowHeight = defaultItemHeight;
    if (rowHeight <= 0) {
        rowHeight = itemDelegate->sizeHint(*option, QModelIndex()).height();
        if (rowHeight <= 0)
            return;
    }
    while (y <= bottom) {
        option->rect.setRect(0, y, viewport->width(), rowHeight);
        option->features.setFlag(QStyleOptionViewItem::Alternate, current & 1);
        ++current;
        q->style()->drawPrimitive(QStyle::PE_PanelItemViewRow, option, painter, q);
        y += rowHeight;
    }
}